

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O3

ref<immutable::transient_rrb<char,_false,_6>_> __thiscall
immutable::rrb_to_transient<char,false,6>(immutable *this,ref<immutable::rrb<char,_false,_6>_> *in)

{
  int *piVar1;
  uint32_t uVar2;
  rrb<char,_false,_6> *prVar3;
  leaf_node<char,_false> *plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  tree_node<char,_false> *ptVar7;
  guid_type gVar8;
  int iVar9;
  undefined8 *puVar10;
  pthread_t pVar11;
  ulong uVar12;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_28;
  
  prVar3 = in->ptr;
  puVar10 = (undefined8 *)malloc(0x30);
  uVar5 = *(undefined8 *)prVar3;
  uVar6 = *(undefined8 *)&prVar3->tail_len;
  ptVar7 = (prVar3->root).ptr;
  puVar10[2] = (prVar3->tail).ptr;
  puVar10[3] = ptVar7;
  *puVar10 = uVar5;
  puVar10[1] = uVar6;
  puVar10[4] = *(undefined8 *)&prVar3->_ref_count;
  if (puVar10[3] != 0) {
    piVar1 = (int *)(puVar10[3] + 8);
    *piVar1 = *piVar1 + 1;
  }
  if (puVar10[2] != 0) {
    piVar1 = (int *)(puVar10[2] + 8);
    *piVar1 = *piVar1 + 1;
  }
  pVar11 = pthread_self();
  puVar10[5] = pVar11;
  *(undefined8 **)this = puVar10;
  *(undefined4 *)(puVar10 + 4) = 1;
  gVar8 = rrb_details::g_guid;
  LOCK();
  UNLOCK();
  iVar9 = rrb_details::g_guid + 1;
  *(guid_type *)((long)puVar10 + 0x24) = rrb_details::g_guid;
  rrb_details::g_guid = iVar9;
  plVar4 = (prVar3->tail).ptr;
  local_28.ptr = (leaf_node<char,_false> *)calloc(1,0x58);
  uVar2 = plVar4->len;
  (local_28.ptr)->len = uVar2;
  (local_28.ptr)->child = (char *)(local_28.ptr + 1);
  if (uVar2 == 0) {
    (local_28.ptr)->guid = gVar8;
    (local_28.ptr)->_ref_count = 1;
  }
  else {
    uVar12 = 0;
    do {
      (local_28.ptr)->child[uVar12] = plVar4->child[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar12 < plVar4->len);
    (local_28.ptr)->guid = gVar8;
    (local_28.ptr)->_ref_count = 1;
    if (puVar10 == (undefined8 *)0x0) {
      __assert_fail("ptr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x71a,
                    "T *immutable::ref<immutable::transient_rrb<char, false, 6>>::operator->() const [T = immutable::transient_rrb<char, false, 6>]"
                   );
    }
  }
  ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
            ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)(puVar10 + 2),&local_28);
  if ((local_28.ptr != (leaf_node<char,_false> *)0x0) &&
     (uVar2 = (local_28.ptr)->_ref_count, (local_28.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
    free(local_28.ptr);
  }
  return (ref<immutable::transient_rrb<char,_false,_6>_>)(transient_rrb<char,_false,_6> *)this;
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> rrb_to_transient(const ref<rrb<T, atomic_ref_counting, N>>& in)
    {
    using namespace rrb_details;
    ref<transient_rrb<T, atomic_ref_counting, N>> trrb = transient_rrb_head_create(in.ptr);
    trrb->guid = rrb_guid_create();
    trrb->tail = transient_leaf_node_clone<T, atomic_ref_counting, N>(in->tail.ptr, trrb->guid);
    return trrb;
    }